

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_dehacked.cpp
# Opt level: O0

bool ReadChars(char **stuff,int size)

{
  bool bVar1;
  char *local_28;
  char *str;
  int size_local;
  char **stuff_local;
  
  local_28 = *stuff;
  str._4_4_ = size;
  if (size == 0) {
    *local_28 = '\0';
  }
  else {
    do {
      if (*PatchPt == '\r') {
        str._4_4_ = str._4_4_ + 1;
      }
      else {
        *local_28 = *PatchPt;
        local_28 = local_28 + 1;
      }
      PatchPt = PatchPt + 1;
      str._4_4_ = str._4_4_ + -1;
      bVar1 = false;
      if (str._4_4_ != 0) {
        bVar1 = *PatchPt != '\0';
      }
    } while (bVar1);
    *local_28 = '\0';
  }
  return true;
}

Assistant:

static bool ReadChars (char **stuff, int size)
{
	char *str = *stuff;

	if (!size) {
		*str = 0;
		return true;
	}

	do {
		// Ignore carriage returns
		if (*PatchPt != '\r')
			*str++ = *PatchPt;
		else
			size++;

		PatchPt++;
	} while (--size && *PatchPt != 0);

	*str = 0;
	return true;
}